

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  secp256k1_scalar *a;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int extraout_EAX_03;
  uint32_t uVar6;
  int extraout_EAX_04;
  ulong uVar7;
  long lVar8;
  ulong extraout_RAX;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar15;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar16;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar17;
  secp256k1_modinv32_modinfo *unaff_RBX;
  secp256k1_modinv32_modinfo *psVar18;
  int *piVar19;
  secp256k1_modinv32_signed30 *psVar20;
  secp256k1_fe *psVar21;
  uint uVar22;
  uint uVar23;
  secp256k1_modinv32_modinfo *unaff_RBP;
  uint8_t *puVar24;
  uint uVar25;
  uint uVar26;
  secp256k1_modinv32_modinfo *psVar27;
  long lVar28;
  secp256k1_modinv32_signed30 *psVar29;
  secp256k1_fe *psVar30;
  secp256k1_fe *psVar31;
  secp256k1_fe *r;
  secp256k1_modinv32_modinfo *a_01;
  secp256k1_modinv32_modinfo *psVar32;
  secp256k1_modinv32_signed30 *a_02;
  secp256k1_modinv32_signed30 *a_03;
  long lVar33;
  ulong uVar34;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  secp256k1_modinv32_modinfo *psVar38;
  uint uVar39;
  int *piVar40;
  uint uVar41;
  secp256k1_modinv32_modinfo *unaff_R12;
  secp256k1_modinv32_modinfo *psVar42;
  secp256k1_modinv32_signed30 *psVar43;
  code *pcVar44;
  uint uVar45;
  ulong unaff_R13;
  secp256k1_modinv32_modinfo *psVar46;
  ulong uVar47;
  secp256k1_modinv32_signed30 *psVar48;
  size_t count;
  uint uVar49;
  secp256k1_modinv32_modinfo *unaff_R14;
  secp256k1_modinv32_modinfo *psVar50;
  secp256k1_modinv32_modinfo *psVar51;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *modinfo_00;
  ulong uVar52;
  code *pcVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  ulong uStack_1658;
  secp256k1_fe *psStack_1650;
  uchar auStack_1648 [4232];
  secp256k1_fe *psStack_5c0;
  code *pcStack_5b8;
  undefined8 uStack_5b0;
  secp256k1_fe *psStack_5a8;
  code *pcStack_5a0;
  code *pcStack_598;
  undefined1 auStack_590 [36];
  int iStack_56c;
  int iStack_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  undefined1 auStack_550 [48];
  code *pcStack_520;
  secp256k1_fe sStack_518;
  secp256k1_fe sStack_4e8;
  secp256k1_fe sStack_4b8;
  ulong uStack_480;
  ulong uStack_478;
  ulong uStack_470;
  secp256k1_modinv32_signed30 *psStack_468;
  ulong uStack_460;
  code *pcStack_458;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint uStack_440;
  uint uStack_43c;
  secp256k1_modinv32_signed30 *psStack_438;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint uStack_420;
  int32_t iStack_41c;
  secp256k1_modinv32_signed30 *psStack_418;
  secp256k1_modinv32_signed30 *psStack_410;
  secp256k1_modinv32_signed30 *psStack_408;
  secp256k1_modinv32_signed30 *psStack_400;
  secp256k1_modinv32_signed30 *psStack_3f8;
  code *pcStack_3f0;
  long lStack_3e0;
  long lStack_3d8;
  int *piStack_3d0;
  secp256k1_modinv32_modinfo *psStack_3c8;
  ulong uStack_3c0;
  ulong uStack_3b0;
  code *pcStack_3a8;
  secp256k1_modinv32_signed30 *psStack_3a0;
  int *piStack_390;
  secp256k1_modinv32_modinfo *psStack_388;
  ulong uStack_380;
  ulong uStack_370;
  code *pcStack_368;
  secp256k1_modinv32_signed30 sStack_360;
  secp256k1_modinv32_signed30 sStack_33c;
  secp256k1_modinv32_modinfo *psStack_318;
  secp256k1_modinv32_modinfo *psStack_310;
  secp256k1_modinv32_modinfo *psStack_300;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  secp256k1_modinv32_modinfo sStack_2e8;
  secp256k1_modinv32_trans2x2 sStack_2b8;
  secp256k1_modinv32_modinfo sStack_2a8;
  secp256k1_modinv32_modinfo *psStack_278;
  long lStack_270;
  secp256k1_modinv32_modinfo sStack_268;
  secp256k1_modinv32_signed30 sStack_238;
  secp256k1_modinv32_modinfo *psStack_210;
  secp256k1_modinv32_modinfo *psStack_208;
  secp256k1_modinv32_modinfo *psStack_200;
  secp256k1_modinv32_modinfo *psStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  code *pcStack_1e8;
  uint uStack_1d4;
  secp256k1_modinv32_trans2x2 sStack_1d0;
  secp256k1_modinv32_modinfo sStack_1c0;
  uint uStack_194;
  secp256k1_modinv32_modinfo sStack_190;
  secp256k1_modinv32_modinfo *psStack_168;
  secp256k1_modinv32_modinfo *psStack_160;
  secp256k1_modinv32_modinfo *psStack_158;
  secp256k1_modinv32_modinfo sStack_150;
  secp256k1_modinv32_signed30 sStack_120;
  secp256k1_modinv32_modinfo *psStack_f8;
  secp256k1_modinv32_modinfo *psStack_f0;
  ulong uStack_e8;
  secp256k1_modinv32_modinfo *psStack_e0;
  secp256k1_modinv32_modinfo *psStack_d8;
  secp256k1_modinv32_modinfo *psStack_d0;
  int local_c0;
  int local_bc;
  secp256k1_modinv32_trans2x2 local_b8;
  secp256k1_modinv32_modinfo local_a8;
  int iStack_7c;
  secp256k1_modinv32_modinfo local_78;
  secp256k1_modinv32_modinfo *local_48;
  secp256k1_modinv32_modinfo *local_40;
  ulong local_38;
  
  local_78.modulus.v[8] = (modinfo->modulus).v[8];
  local_78.modulus.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_78.modulus.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_78.modulus.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_78.modulus.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_a8.modulus.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_a8.modulus.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_a8.modulus.v._24_8_ = *(undefined8 *)(x->v + 6);
  local_a8.modulus.v[0] = (int32_t)*(undefined8 *)x->v;
  local_a8.modulus.v[1] = (int32_t)((ulong)*(undefined8 *)x->v >> 0x20);
  local_a8.modulus.v[8] = x->v[8];
  auVar58 = packssdw(*(undefined1 (*) [16])x->v,*(undefined1 (*) [16])(x->v + 4));
  psVar32 = modinfo;
  if (((((((((auVar58 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar58 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar58 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar58 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar58[0xf]) &&
     (-1 < local_a8.modulus.v[8])) {
    uVar25 = local_a8.modulus.v[3] | local_a8.modulus.v[2] |
             local_a8.modulus.v[1] | local_a8.modulus.v[0];
    psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
    psVar51 = unaff_RBP;
    psVar50 = unaff_R14;
    if ((local_a8.modulus.v[7] != 0 ||
        ((local_a8.modulus.v[6] != 0 || (local_a8.modulus.v[5] != 0 || local_a8.modulus.v[4] != 0))
        || uVar25 != 0)) || local_a8.modulus.v[8] != 0) {
      psVar50 = (secp256k1_modinv32_modinfo *)0x9;
      unaff_R13 = 0xffffffff;
      local_bc = 0;
      unaff_R12 = (secp256k1_modinv32_modinfo *)0x0;
      local_48 = modinfo;
      do {
        modinfo = local_48;
        uVar17 = local_78.modulus.v[1] << 0x1e | local_78.modulus.v[0];
        unaff_RBX = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
        uVar26 = local_a8.modulus.v[1] << 0x1e | local_a8.modulus.v[0];
        psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
        uVar25 = 1;
        psVar46 = (secp256k1_modinv32_modinfo *)0x0;
        uVar4 = 0x1e;
        x = (secp256k1_modinv32_signed30 *)0x0;
        uVar35 = 1;
        unaff_RBP = unaff_RBX;
        psVar42 = unaff_R12;
        uVar37 = uVar26;
        while( true ) {
          uVar39 = (uint)unaff_RBP;
          uVar22 = -1 << ((byte)uVar4 & 0x1f) | uVar37;
          uVar10 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          bVar9 = (byte)uVar10;
          uVar37 = uVar37 >> (bVar9 & 0x1f);
          uVar35 = uVar35 << (bVar9 & 0x1f);
          uVar22 = (int)x << (bVar9 & 0x1f);
          x = (secp256k1_modinv32_signed30 *)(ulong)uVar22;
          uVar45 = (int)unaff_R13 - uVar10;
          unaff_R13 = (ulong)uVar45;
          psVar51 = (secp256k1_modinv32_modinfo *)((ulong)unaff_RBP >> 1);
          uVar41 = ((uint)((ulong)unaff_RBP >> 2) ^ (uint)psVar51) & uVar10 ^ (uint)psVar42;
          unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
          uVar4 = uVar4 - uVar10;
          uVar10 = (uint)psVar46;
          local_40 = psVar50;
          if (uVar4 == 0) break;
          if (((ulong)unaff_RBP & 1) == 0) {
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e40;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_00154e40:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e45;
            secp256k1_jacobi32_maybe_var_cold_5();
            unaff_R14 = psVar42;
LAB_00154e45:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e4a;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_00154e4a:
            unaff_RBP = psVar51;
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e4f;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_00154e4f:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e54;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_00154e54;
          }
          if ((uVar37 & 1) == 0) goto LAB_00154e40;
          uVar23 = uVar22 * uVar26 + uVar35 * uVar17;
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
          bVar9 = 0x1e - (char)uVar4;
          uVar49 = uVar39 << (bVar9 & 0x1f);
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar49;
          if (uVar23 != uVar49) goto LAB_00154e45;
          uVar49 = uVar25 * uVar26 + uVar10 * uVar17;
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar49;
          uVar23 = uVar37 << (bVar9 & 0x1f);
          psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
          if (uVar49 != uVar23) goto LAB_00154e4a;
          unaff_R14 = psVar46;
          if ((int)uVar45 < 0) {
            unaff_R13 = (ulong)-uVar45;
            unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)(uVar41 ^ (uVar37 & uVar39) >> 1);
            unaff_RBP = (secp256k1_modinv32_modinfo *)(ulong)uVar37;
            x = (secp256k1_modinv32_signed30 *)(ulong)uVar25;
            unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar35;
            uVar35 = uVar10;
            uVar37 = uVar39;
            uVar25 = uVar22;
          }
          unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
          uVar10 = (int)unaff_R13 + 1;
          if ((int)uVar4 <= (int)uVar10) {
            uVar10 = uVar4;
          }
          if (0x1e < uVar10) goto LAB_00154e4f;
          uVar10 = (uint)(0xff << (-(char)uVar10 & 0x1fU)) >> (-(char)uVar10 & 0x1fU);
          uVar39 = secp256k1_modinv32_inv256[(uint)((ulong)unaff_RBP >> 1) & 0x7f] * uVar37 & uVar10
          ;
          uVar37 = uVar39 * (int)unaff_RBP + uVar37;
          psVar46 = (secp256k1_modinv32_modinfo *)(ulong)(uVar39 * uVar35 + (int)unaff_R14);
          uVar25 = uVar39 * (int)x + uVar25;
          psVar42 = unaff_R12;
          local_38 = unaff_R13;
          if ((uVar37 & uVar10) != 0) {
LAB_00154e54:
            psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e59;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_00154e59;
          }
        }
        lVar8 = (long)(int)uVar25 * (long)(int)uVar35 - (long)(int)uVar10 * (long)(int)uVar22;
        unaff_R15 = &local_78;
        local_b8.u = uVar35;
        local_b8.v = uVar22;
        local_b8.q = uVar10;
        local_b8.r = uVar25;
        if ((lVar8 != -0x40000000) && (lVar8 != 0x40000000)) goto LAB_00154e8b;
        iVar11 = (int)psVar50;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x154cda;
        psVar32 = psVar50;
        x = &unaff_R15->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&local_48->modulus,0);
        unaff_RBP = &local_a8;
        if (iVar5 < 1) goto LAB_00154e5e;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x154cfa;
        psVar32 = psVar50;
        x = &unaff_R15->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,1);
        if (0 < iVar5) goto LAB_00154e63;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x154d12;
        psVar32 = psVar50;
        x = &unaff_RBP->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,0);
        if (iVar5 < 1) goto LAB_00154e68;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x154d2d;
        psVar32 = psVar50;
        x = &unaff_RBP->modulus;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,1);
        if (-1 < iVar5) goto LAB_00154e6d;
        psStack_d0 = (secp256k1_modinv32_modinfo *)0x154d48;
        secp256k1_modinv32_update_fg_30_var
                  (iVar11,&unaff_R15->modulus,&unaff_RBP->modulus,&local_b8);
        if (local_78.modulus.v[0] == 1) {
          if (1 < iVar11) {
            uVar25 = 0;
            psVar32 = (secp256k1_modinv32_modinfo *)0x1;
            do {
              uVar25 = uVar25 | local_78.modulus.v[(long)psVar32];
              psVar32 = (secp256k1_modinv32_modinfo *)((long)(psVar32->modulus).v + 1);
            } while (psVar50 != psVar32);
            if (uVar25 != 0) goto LAB_00154d77;
          }
          local_c0 = 1 - (uVar41 * 2 & 2);
          bVar54 = false;
        }
        else {
LAB_00154d77:
          if ((-1 < iVar11 + -2 && (&iStack_7c)[iVar11] == 0) &&
              local_a8.modulus.v[(long)iVar11 + -1] == 0) {
            psVar50 = (secp256k1_modinv32_modinfo *)(ulong)(iVar11 - 1);
          }
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x154da1;
          iVar11 = (int)psVar50;
          psVar32 = psVar50;
          x = &unaff_R15->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,0);
          if (iVar5 < 1) goto LAB_00154e72;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x154dbc;
          psVar32 = psVar50;
          x = &unaff_R15->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar11,&modinfo->modulus,1);
          if (0 < iVar5) goto LAB_00154e77;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x154dd4;
          psVar32 = psVar50;
          x = &unaff_RBP->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,0);
          if (iVar5 < 1) goto LAB_00154e7c;
          psStack_d0 = (secp256k1_modinv32_modinfo *)0x154def;
          psVar32 = psVar50;
          x = &unaff_RBP->modulus;
          iVar5 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar11,&modinfo->modulus,1);
          bVar54 = true;
          if (-1 < iVar5) goto LAB_00154e81;
        }
        if (!bVar54) {
          return local_c0;
        }
        local_bc = local_bc + 1;
        if (local_bc == 0x19) {
          return 0;
        }
      } while( true );
    }
  }
  else {
LAB_00154e59:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e5e;
    secp256k1_jacobi32_maybe_var_cold_17();
    modinfo = unaff_RBX;
    psVar50 = unaff_R14;
LAB_00154e5e:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e63;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_00154e63:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e68;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_00154e68:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e6d;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_00154e6d:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e72;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_00154e72:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e77;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_00154e77:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e7c;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_00154e7c:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e81;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_00154e81:
    psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e86;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar51 = unaff_RBP;
  }
  psStack_d0 = (secp256k1_modinv32_modinfo *)0x154e8b;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_00154e8b:
  psStack_d0 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_d0 = psVar51;
  psStack_d8 = unaff_R15;
  psStack_e0 = psVar50;
  uStack_e8 = unaff_R13;
  psStack_f0 = unaff_R12;
  psStack_f8 = modinfo;
  psVar51 = (secp256k1_modinv32_modinfo *)0x0;
  sStack_150.modulus.v[8] = 0;
  sStack_150.modulus.v[4] = 0;
  sStack_150.modulus.v[5] = 0;
  sStack_150.modulus.v[6] = 0;
  sStack_150.modulus.v[7] = 0;
  sStack_150.modulus.v[0] = 0;
  sStack_150.modulus.v[1] = 0;
  sStack_150.modulus.v[2] = 0;
  sStack_150.modulus.v[3] = 0;
  sStack_120.v[2] = 0;
  sStack_120.v[3] = 0;
  sStack_120.v[8] = 0;
  sStack_120.v[4] = 0;
  sStack_120.v[5] = 0;
  sStack_120.v[6] = 0;
  sStack_120.v[7] = 0;
  sStack_120.v[0] = 1;
  sStack_120.v[1] = 0;
  sStack_190.modulus.v[8] = (psVar32->modulus).v[8];
  sStack_190.modulus.v._16_8_ = *(undefined8 *)((psVar32->modulus).v + 4);
  sStack_190.modulus.v._24_8_ = *(undefined8 *)((psVar32->modulus).v + 6);
  sStack_190.modulus.v._0_8_ = *(ulong *)(psVar32->modulus).v;
  sStack_190.modulus.v._8_8_ = *(undefined8 *)((psVar32->modulus).v + 2);
  sStack_1c0.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  sStack_1c0.modulus.v._0_8_ = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_1c0.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  psStack_168 = (secp256k1_modinv32_modinfo *)x;
  sStack_1c0.modulus.v._16_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 4);
  sStack_1c0.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  psVar42 = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar50 = (secp256k1_modinv32_modinfo *)0x9;
  puVar24 = secp256k1_modinv32_inv256;
  psStack_160 = psVar32;
  do {
    modinfo_00 = psStack_160;
    uStack_1d4 = (uint)psVar51;
    psVar27 = (secp256k1_modinv32_modinfo *)(sStack_190.modulus.v._0_8_ & 0xffffffff);
    a_01 = (secp256k1_modinv32_modinfo *)(sStack_1c0.modulus.v._0_8_ & 0xffffffff);
    uVar25 = 1;
    psVar38 = (secp256k1_modinv32_modinfo *)0x0;
    iVar5 = 0x1e;
    uVar4 = 0;
    psVar46 = (secp256k1_modinv32_modinfo *)0x1;
    uVar35 = sStack_190.modulus.v[0];
    uVar37 = sStack_1c0.modulus.v[0];
    while( true ) {
      uVar17 = -1 << ((byte)iVar5 & 0x1f) | uVar37;
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      iVar11 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
        }
      }
      bVar9 = (byte)iVar11;
      uVar37 = uVar37 >> (bVar9 & 0x1f);
      uVar26 = (int)psVar46 << (bVar9 & 0x1f);
      psVar46 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      uVar4 = uVar4 << (bVar9 & 0x1f);
      uVar17 = (int)psVar42 - iVar11;
      psVar42 = (secp256k1_modinv32_modinfo *)(ulong)uVar17;
      iVar5 = iVar5 - iVar11;
      iVar11 = (int)psVar38;
      psStack_158 = psVar50;
      if (iVar5 == 0) break;
      if ((uVar35 & 1) == 0) {
        pcStack_1e8 = (code *)0x15534e;
        secp256k1_modinv32_var_cold_7();
LAB_0015534e:
        pcStack_1e8 = (code *)0x155353;
        secp256k1_modinv32_var_cold_6();
LAB_00155353:
        pcStack_1e8 = (code *)0x155358;
        secp256k1_modinv32_var_cold_1();
LAB_00155358:
        pcStack_1e8 = (code *)0x15535d;
        secp256k1_modinv32_var_cold_2();
LAB_0015535d:
        pcStack_1e8 = (code *)0x155362;
        secp256k1_modinv32_var_cold_5();
LAB_00155362:
        pcStack_1e8 = (code *)0x155367;
        secp256k1_modinv32_var_cold_4();
        goto LAB_00155367;
      }
      if ((uVar37 & 1) == 0) goto LAB_0015534e;
      uVar10 = uVar4 * sStack_1c0.modulus.v[0] + uVar26 * sStack_190.modulus.v[0];
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
      bVar9 = 0x1e - (char)iVar5;
      uVar39 = uVar35 << (bVar9 & 0x1f);
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar10 != uVar39) goto LAB_00155353;
      uVar39 = uVar25 * sStack_1c0.modulus.v[0] + iVar11 * sStack_190.modulus.v[0];
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar10 = uVar37 << (bVar9 & 0x1f);
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar10;
      if (uVar39 != uVar10) goto LAB_00155358;
      if (uVar17 - 0x2f0 < 0xfffffa21) goto LAB_0015535d;
      psVar51 = psVar38;
      if ((int)uVar17 < 0) {
        psVar42 = (secp256k1_modinv32_modinfo *)(ulong)-uVar17;
        uVar17 = -uVar35;
        uVar10 = -uVar4;
        psVar46 = psVar38;
        psVar51 = (secp256k1_modinv32_modinfo *)(ulong)-uVar26;
        uVar35 = uVar37;
        uVar37 = uVar17;
        uVar4 = uVar25;
        uVar25 = uVar10;
      }
      psVar18 = (secp256k1_modinv32_modinfo *)(ulong)uVar25;
      iVar11 = (int)psVar42 + 1;
      if (iVar5 <= iVar11) {
        iVar11 = iVar5;
      }
      if (iVar11 - 0x1fU < 0xffffffe2) goto LAB_00155362;
      uVar26 = (uint)(0xff << (-(char)iVar11 & 0x1fU)) >> (-(char)iVar11 & 0x1fU);
      psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      uVar17 = secp256k1_modinv32_inv256[uVar35 >> 1 & 0x7f] * uVar37 & uVar26;
      uVar37 = uVar37 + uVar17 * uVar35;
      psVar38 = (secp256k1_modinv32_modinfo *)(ulong)(uVar17 * (int)psVar46 + (int)psVar51);
      uVar25 = uVar17 * uVar4 + uVar25;
      if ((uVar37 & uVar26) != 0) {
LAB_00155367:
        pcStack_1e8 = (code *)0x15536c;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0015536c;
      }
    }
    sStack_1d0.u = uVar26;
    sStack_1d0.v = uVar4;
    sStack_1d0.q = iVar11;
    sStack_1d0.r = uVar25;
    if ((long)(int)uVar25 * (long)(int)uVar26 - (long)iVar11 * (long)(int)uVar4 != 0x40000000) {
LAB_0015536c:
      pcStack_1e8 = (code *)0x155371;
      secp256k1_modinv32_var_cold_8();
      psVar50 = psVar18;
      modinfo_00 = psVar32;
LAB_00155371:
      pcStack_1e8 = (code *)0x155376;
      secp256k1_modinv32_var_cold_19();
LAB_00155376:
      pcStack_1e8 = (code *)0x15537b;
      secp256k1_modinv32_var_cold_18();
LAB_0015537b:
      pcStack_1e8 = (code *)0x155380;
      secp256k1_modinv32_var_cold_17();
LAB_00155380:
      pcStack_1e8 = (code *)0x155385;
      secp256k1_modinv32_var_cold_16();
LAB_00155385:
      pcStack_1e8 = (code *)0x15538a;
      secp256k1_modinv32_var_cold_13();
LAB_0015538a:
      pcStack_1e8 = (code *)0x15538f;
      secp256k1_modinv32_var_cold_12();
LAB_0015538f:
      pcStack_1e8 = (code *)0x155394;
      secp256k1_modinv32_var_cold_11();
LAB_00155394:
      pcStack_1e8 = (code *)0x155399;
      secp256k1_modinv32_var_cold_10();
LAB_00155399:
      pcStack_1e8 = (code *)0x15539e;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0015539e;
    }
    pcStack_1e8 = (code *)0x1550cf;
    secp256k1_modinv32_update_de_30(&sStack_150.modulus,&sStack_120,&sStack_1d0,psStack_160);
    psVar50 = psStack_158;
    psVar46 = &sStack_190;
    iVar11 = (int)psStack_158;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psStack_158 & 0xffffffff);
    pcStack_1e8 = (code *)0x1550ee;
    a_01 = psVar46;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
    if (iVar5 < 1) goto LAB_00155371;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x155108;
    a_01 = psVar46;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
    if (0 < iVar5) goto LAB_00155376;
    psVar51 = &sStack_1c0;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x155127;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,iVar11,&modinfo_00->modulus,-1);
    if (iVar5 < 1) goto LAB_0015537b;
    psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
    pcStack_1e8 = (code *)0x155141;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,iVar11,&modinfo_00->modulus,1);
    if (-1 < iVar5) goto LAB_00155380;
    pcStack_1e8 = (code *)0x15515b;
    secp256k1_modinv32_update_fg_30_var(iVar11,&psVar46->modulus,&psVar51->modulus,&sStack_1d0);
    uVar25 = uStack_1d4;
    psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uStack_1d4;
    if (sStack_1c0.modulus.v[0] != 0) {
LAB_0015516b:
      uVar35 = (&uStack_194)[iVar11];
      uVar37 = sStack_1c0.modulus.v[(long)iVar11 + -1];
      iVar5 = iVar11 + -2;
      uVar4 = (int)uVar35 >> 0x1f ^ uVar35 | iVar5 >> 0x1f;
      a_01 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      uVar4 = (int)uVar37 >> 0x1f ^ uVar37 | uVar4;
      psVar27 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      if (uVar4 == 0) {
        psVar50 = (secp256k1_modinv32_modinfo *)(ulong)(iVar11 - 1);
        piVar16 = sStack_190.modulus.v + iVar5;
        *piVar16 = *piVar16 | uVar35 << 0x1e;
        piVar16 = sStack_1c0.modulus.v + iVar5;
        *piVar16 = *piVar16 | uVar37 << 0x1e;
      }
      if (0x17 < (int)uStack_1d4) goto LAB_00155385;
      iVar11 = (int)psVar50;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x1551c1;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
      if (iVar5 < 1) goto LAB_0015538a;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x1551db;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
      if (0 < iVar5) goto LAB_0015538f;
      psVar46 = &sStack_1c0;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x1551fa;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,-1);
      if (iVar5 < 1) goto LAB_00155394;
      psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
      pcStack_1e8 = (code *)0x155214;
      a_01 = psVar46;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar46->modulus,iVar11,&modinfo_00->modulus,1);
      if (iVar5 < 0) {
        psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(uVar25 + 1);
        uVar35 = 1;
        goto LAB_00155247;
      }
      goto LAB_00155399;
    }
    uVar35 = 0;
    if (1 < iVar11) {
      uVar52 = 1;
      do {
        uVar35 = uVar35 | sStack_1c0.modulus.v[uVar52];
        uVar52 = uVar52 + 1;
      } while (((ulong)psVar50 & 0xffffffff) != uVar52);
      if (uVar35 != 0) goto LAB_0015516b;
      uVar35 = 0;
    }
LAB_00155247:
    psVar32 = modinfo_00;
  } while ((char)uVar35 != '\0');
  a_01 = &sStack_1c0;
  iVar11 = (int)psVar50;
  psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
  pcStack_1e8 = (code *)0x155264;
  iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar11,&SECP256K1_SIGNED30_ONE,0);
  if (iVar5 == 0) {
    pcStack_1e8 = (code *)0x155284;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_190.modulus,iVar11,&SECP256K1_SIGNED30_ONE,-1);
    psVar51 = psStack_168;
    if (iVar5 == 0) {
LAB_00155306:
      pcStack_1e8 = (code *)0x155320;
      secp256k1_modinv32_normalize_30(&sStack_150.modulus,(&uStack_194)[iVar11],modinfo_00);
      (psVar51->modulus).v[8] = sStack_150.modulus.v[8];
      *(undefined8 *)((psVar51->modulus).v + 4) = sStack_150.modulus.v._16_8_;
      *(undefined8 *)((psVar51->modulus).v + 6) = sStack_150.modulus.v._24_8_;
      *(undefined8 *)(psVar51->modulus).v = sStack_150.modulus.v._0_8_;
      *(undefined8 *)((psVar51->modulus).v + 2) = sStack_150.modulus.v._8_8_;
      return sStack_150.modulus.v[8];
    }
    pcStack_1e8 = (code *)0x1552a5;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_190.modulus,iVar11,&SECP256K1_SIGNED30_ONE,1);
    if (iVar5 == 0) goto LAB_00155306;
    psVar27 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_1e8 = (code *)0x1552bf;
    a_01 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar5 == 0) {
      a_01 = &sStack_150;
      psVar27 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_1e8 = (code *)0x1552e2;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar5 == 0) {
        a_01 = &sStack_190;
        psVar27 = (secp256k1_modinv32_modinfo *)((ulong)psVar50 & 0xffffffff);
        pcStack_1e8 = (code *)0x1552fe;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar11,&modinfo_00->modulus,1);
        if (iVar5 == 0) goto LAB_00155306;
      }
    }
  }
  else {
LAB_0015539e:
    pcStack_1e8 = (code *)0x1553a3;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_1e8 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_1e8 = (code *)secp256k1_modinv32_inv256;
  psStack_1f0 = modinfo_00;
  psStack_1f8 = psVar51;
  psStack_200 = psVar46;
  psStack_208 = psVar42;
  psStack_210 = psVar50;
  uVar25 = 0;
  sStack_268.modulus.v[8] = 0;
  sStack_268.modulus.v[4] = 0;
  sStack_268.modulus.v[5] = 0;
  sStack_268.modulus.v[6] = 0;
  sStack_268.modulus.v[7] = 0;
  sStack_268.modulus.v[0] = 0;
  sStack_268.modulus.v[1] = 0;
  sStack_268.modulus.v[2] = 0;
  sStack_268.modulus.v[3] = 0;
  sStack_238.v[2] = 0;
  sStack_238.v[3] = 0;
  sStack_238.v[8] = 0;
  sStack_238.v[4] = 0;
  sStack_238.v[5] = 0;
  sStack_238.v[6] = 0;
  sStack_238.v[7] = 0;
  sStack_238.v[0] = 1;
  sStack_238.v[1] = 0;
  sStack_2e8.modulus.v[8] = (psVar27->modulus).v[8];
  sStack_2e8.modulus.v._16_8_ = *(undefined8 *)((psVar27->modulus).v + 4);
  sStack_2e8.modulus.v._24_8_ = *(undefined8 *)((psVar27->modulus).v + 6);
  sStack_2e8.modulus.v._0_8_ = *(undefined8 *)(psVar27->modulus).v;
  sStack_2e8.modulus.v._8_8_ = *(undefined8 *)((psVar27->modulus).v + 2);
  sStack_2a8.modulus.v[8] = (a_01->modulus).v[8];
  sStack_2a8.modulus.v._0_8_ = *(undefined8 *)(a_01->modulus).v;
  sStack_2a8.modulus.v._8_8_ = *(undefined8 *)((a_01->modulus).v + 2);
  psStack_278 = a_01;
  sStack_2a8.modulus.v._16_8_ = *(undefined8 *)((a_01->modulus).v + 4);
  sStack_2a8.modulus.v._24_8_ = *(undefined8 *)((a_01->modulus).v + 6);
  uVar52 = 0xffffffff;
  psStack_300 = psVar27;
  do {
    lStack_270 = (long)sStack_2e8.modulus.v[0];
    uVar47 = (ulong)sStack_2a8.modulus.v[0];
    uVar13 = 0;
    psVar32 = (secp256k1_modinv32_modinfo *)0x1;
    uVar35 = 0;
    uVar17 = 0;
    uVar26 = 1;
    uVar37 = sStack_2a8.modulus.v[0];
    uVar4 = sStack_2e8.modulus.v[0];
    do {
      uVar10 = sStack_2e8.modulus.v[0];
      uStack_2f4 = uVar25;
      if ((uVar4 & 1) == 0) {
        psStack_310 = (secp256k1_modinv32_modinfo *)0x15585f;
        secp256k1_modinv32_cold_17();
LAB_0015585f:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x155864;
        secp256k1_modinv32_cold_1();
LAB_00155864:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x155869;
        secp256k1_modinv32_cold_2();
        psVar46 = psVar42;
LAB_00155869:
        psStack_310 = (secp256k1_modinv32_modinfo *)0x15586e;
        secp256k1_modinv32_cold_16();
        goto LAB_0015586e;
      }
      uVar41 = (uint)psVar32;
      uVar22 = uVar35 * sStack_2a8.modulus.v[0] + uVar41 * sStack_2e8.modulus.v[0];
      puVar24 = (uint8_t *)(ulong)uVar22;
      uVar39 = uVar4 << ((byte)uVar13 & 0x1f);
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar22 != uVar39) goto LAB_0015585f;
      uVar22 = uVar26 * sStack_2a8.modulus.v[0] + uVar17 * sStack_2e8.modulus.v[0];
      puVar24 = (uint8_t *)(ulong)uVar22;
      uVar39 = uVar37 << ((byte)uVar13 & 0x1f);
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      if (uVar22 != uVar39) goto LAB_00155864;
      uStack_2ec = (int)(uint)uVar52 >> 0x1f;
      puVar24 = (uint8_t *)(ulong)uStack_2ec;
      uStack_2f0 = uVar37 & 1;
      uVar39 = -uStack_2f0;
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar22 = uStack_2ec & uVar39;
      psVar50 = (secp256k1_modinv32_modinfo *)(ulong)uVar22;
      uVar45 = (uint)uVar52 ^ uVar22;
      uVar52 = (ulong)uVar45;
      psVar46 = (secp256k1_modinv32_modinfo *)(ulong)(uVar45 - 0x25b);
      if (uVar45 - 0x25b < 0xfffffb4d) goto LAB_00155869;
      uVar52 = (ulong)(uVar45 - 1);
      uVar26 = uVar26 + ((uStack_2ec ^ uVar35) - uStack_2ec & uVar39);
      uVar35 = (uVar35 + (uVar26 & uVar22)) * 2;
      uVar17 = uVar17 + ((uStack_2ec ^ uVar41) - uStack_2ec & uVar39);
      uVar41 = (uVar41 + (uVar17 & uVar22)) * 2;
      psVar32 = (secp256k1_modinv32_modinfo *)(ulong)uVar41;
      uVar39 = ((uStack_2ec ^ uVar4) - uStack_2ec & uVar39) + uVar37;
      uVar37 = uVar39 >> 1;
      uVar39 = uVar39 & uVar22;
      psVar42 = (secp256k1_modinv32_modinfo *)(ulong)uVar39;
      uVar4 = uVar4 + uVar39;
      uVar39 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar39;
    } while (uVar39 != 0x1e);
    psVar50 = (secp256k1_modinv32_modinfo *)(long)(int)uVar41;
    psVar51 = (secp256k1_modinv32_modinfo *)(long)(int)uVar26;
    puVar24 = (uint8_t *)(long)(int)uVar35;
    psVar46 = (secp256k1_modinv32_modinfo *)(long)(int)uVar17;
    uVar13 = (long)psVar50 * (long)psVar51 - (long)puVar24 * (long)psVar46;
    sStack_2b8.u = uVar41;
    sStack_2b8.v = uVar35;
    sStack_2b8.q = uVar17;
    sStack_2b8.r = uVar26;
    if (uVar13 != 0x40000000) {
LAB_0015586e:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155873;
      secp256k1_modinv32_cold_3();
LAB_00155873:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155878;
      secp256k1_modinv32_cold_15();
LAB_00155878:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x15587d;
      secp256k1_modinv32_cold_14();
LAB_0015587d:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155882;
      secp256k1_modinv32_cold_13();
LAB_00155882:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155887;
      secp256k1_modinv32_cold_12();
LAB_00155887:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x15588c;
      secp256k1_modinv32_cold_4();
LAB_0015588c:
      psVar42 = psVar46;
      uVar25 = (uint)uVar13;
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155891;
      secp256k1_modinv32_cold_5();
LAB_00155891:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155896;
      secp256k1_modinv32_cold_11();
LAB_00155896:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x15589b;
      secp256k1_modinv32_cold_10();
LAB_0015589b:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x1558a0;
      secp256k1_modinv32_cold_9();
LAB_001558a0:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x1558a5;
      secp256k1_modinv32_cold_8();
      goto LAB_001558a5;
    }
    psStack_310 = (secp256k1_modinv32_modinfo *)0x155591;
    secp256k1_modinv32_update_de_30(&sStack_268.modulus,&sStack_238,&sStack_2b8,psStack_300);
    psVar32 = &sStack_2e8;
    uVar10 = 9;
    uVar13 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1555aa;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_00155873;
    psVar32 = &sStack_2e8;
    uVar10 = 9;
    uVar13 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1555cb;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,1);
    if (0 < iVar5) goto LAB_00155878;
    psVar32 = &sStack_2a8;
    uVar10 = 9;
    uVar13 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1555ec;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_0015587d;
    psVar32 = &sStack_2a8;
    uVar10 = 9;
    uVar13 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x15560d;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psStack_300->modulus,1);
    psVar42 = psStack_300;
    if (-1 < iVar5) goto LAB_00155882;
    uVar13 = (long)psVar50 * lStack_270;
    uVar7 = (long)puVar24 * uVar47 + uVar13;
    if ((uVar7 & 0x3ffffffe) != 0) goto LAB_00155887;
    uVar47 = uVar47 * (long)psVar51 + lStack_270 * (long)psVar46;
    if ((uVar47 & 0x3fffffff) != 0) goto LAB_0015588c;
    uVar47 = (long)uVar47 >> 0x1e;
    lVar8 = (long)uVar7 >> 0x1e;
    lVar14 = 1;
    do {
      lVar15 = (long)sStack_2e8.modulus.v[lVar14];
      lVar28 = (long)sStack_2a8.modulus.v[lVar14];
      lVar8 = lVar28 * (long)puVar24 + lVar15 * (long)psVar50 + lVar8;
      lVar15 = lVar28 * (long)psVar51 + lVar15 * (long)psVar46 + uVar47;
      (&uStack_2ec)[lVar14] = (uint)lVar8 & 0x3fffffff;
      sStack_2a8.modulus.v[lVar14 + -1] = (uint)lVar15 & 0x3fffffff;
      lVar14 = lVar14 + 1;
      uVar47 = lVar15 >> 0x1e;
      lVar8 = lVar8 >> 0x1e;
    } while (lVar14 != 9);
    sStack_2e8.modulus.v[8] = (int32_t)lVar8;
    sStack_2a8.modulus.v[8] = (int32_t)uVar47;
    psVar50 = &sStack_2e8;
    uVar10 = 9;
    uVar25 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1556e1;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psStack_300->modulus,-1);
    if (iVar5 < 1) goto LAB_00155891;
    uVar10 = 9;
    uVar25 = 1;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1556fe;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,1);
    if (0 < iVar5) goto LAB_00155896;
    psVar50 = &sStack_2a8;
    uVar10 = 9;
    uVar25 = 0xffffffff;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x155720;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,-1);
    if (iVar5 < 1) goto LAB_0015589b;
    uVar10 = 9;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x15573d;
    psVar32 = psVar50;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar50->modulus,9,&psVar42->modulus,1);
    uVar25 = uStack_2f4;
    if (-1 < iVar5) goto LAB_001558a0;
    uVar25 = uStack_2f4 + 1;
  } while (uVar25 != 0x14);
  psVar32 = &sStack_2a8;
  uVar10 = 9;
  uVar25 = 0;
  psStack_310 = (secp256k1_modinv32_modinfo *)0x15576c;
  iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar5 == 0) {
    psStack_310 = (secp256k1_modinv32_modinfo *)0x15578f;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_2e8.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar51 = psStack_278;
    if (iVar5 == 0) {
LAB_0015581a:
      psStack_310 = (secp256k1_modinv32_modinfo *)0x155831;
      secp256k1_modinv32_normalize_30(&sStack_268.modulus,sStack_2e8.modulus.v[8],psVar42);
      (psVar51->modulus).v[8] = sStack_268.modulus.v[8];
      *(undefined8 *)((psVar51->modulus).v + 4) = sStack_268.modulus.v._16_8_;
      *(undefined8 *)((psVar51->modulus).v + 6) = sStack_268.modulus.v._24_8_;
      *(undefined8 *)(psVar51->modulus).v = sStack_268.modulus.v._0_8_;
      *(undefined8 *)((psVar51->modulus).v + 2) = sStack_268.modulus.v._8_8_;
      return sStack_268.modulus.v[8];
    }
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1557b6;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&sStack_2e8.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar5 == 0) goto LAB_0015581a;
    uVar10 = 9;
    uVar25 = 0;
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1557d0;
    psVar32 = psVar51;
    iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar5 == 0) {
      psVar32 = &sStack_268;
      uVar10 = 9;
      uVar25 = 0;
      psStack_310 = (secp256k1_modinv32_modinfo *)0x1557f3;
      iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar5 == 0) {
        psVar32 = &sStack_2e8;
        uVar10 = 9;
        uVar25 = 1;
        psStack_310 = (secp256k1_modinv32_modinfo *)0x155812;
        iVar5 = secp256k1_modinv32_mul_cmp_30(&psVar32->modulus,9,&psVar42->modulus,1);
        if (iVar5 == 0) goto LAB_0015581a;
      }
    }
  }
  else {
LAB_001558a5:
    psStack_310 = (secp256k1_modinv32_modinfo *)0x1558aa;
    secp256k1_modinv32_cold_6();
  }
  psStack_310 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_02 = &sStack_360;
  piVar19 = (int *)(ulong)uVar25;
  pcStack_368 = (code *)0x1558cf;
  psStack_318 = psVar50;
  psStack_310 = psVar51;
  secp256k1_modinv32_mul_30(&sStack_33c,&psVar32->modulus,uVar10,1);
  pcStack_368 = (code *)0x1558e1;
  piVar40 = piVar19;
  psVar29 = a_00;
  secp256k1_modinv32_mul_30(&sStack_360,a_00,9,uVar25);
  lVar8 = 0;
  while ((uint)sStack_33c.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_360.v[lVar8]) goto LAB_00155933;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar25 = 8;
      while( true ) {
        if (sStack_33c.v[uVar25] < sStack_360.v[uVar25]) {
          return -1;
        }
        if (sStack_360.v[uVar25] < sStack_33c.v[uVar25]) break;
        bVar54 = uVar25 == 0;
        uVar25 = uVar25 - 1;
        if (bVar54) {
          return 0;
        }
      }
      return 1;
    }
  }
  pcStack_368 = (code *)0x155933;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00155933:
  pcStack_368 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar5 = (int)a_02;
  piStack_390 = piVar19;
  psStack_388 = psVar42;
  uStack_380 = uVar47;
  uStack_370 = uVar52;
  pcStack_368 = (code *)puVar24;
  if (iVar5 < 1) {
    psStack_3a0 = (secp256k1_modinv32_signed30 *)0x155a26;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00155a26:
    iVar12 = (int)piVar40;
    psStack_3a0 = (secp256k1_modinv32_signed30 *)0x155a2b;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar11 = piVar40[1];
    iVar2 = *piVar40;
    piVar19 = (int *)(long)psVar29->v[0];
    uVar13 = (long)*extraout_RDX * (long)iVar11 + (long)piVar19 * (long)iVar2;
    if ((uVar13 & 0x3fffffff) != 0) goto LAB_00155a26;
    iVar3 = piVar40[3];
    iVar12 = piVar40[2];
    piVar19 = (int *)((long)piVar19 * (long)iVar12);
    piVar40 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar19);
    if (((ulong)piVar40 & 0x3fffffff) == 0) {
      lVar14 = (long)piVar40 >> 0x1e;
      lVar8 = (long)uVar13 >> 0x1e;
      if (iVar5 != 1) {
        uVar52 = 1;
        do {
          lVar8 = (long)extraout_RDX[uVar52] * (long)iVar11 +
                  (long)psVar29->v[uVar52] * (long)iVar2 + lVar8;
          lVar14 = (long)extraout_RDX[uVar52] * (long)iVar3 +
                   (long)psVar29->v[uVar52] * (long)iVar12 + lVar14;
          psVar29->v[uVar52 - 1] = (uint)lVar8 & 0x3fffffff;
          extraout_RDX[uVar52 - 1] = (uint)lVar14 & 0x3fffffff;
          uVar52 = uVar52 + 1;
          lVar14 = lVar14 >> 0x1e;
          lVar8 = lVar8 >> 0x1e;
        } while (((ulong)a_02 & 0xffffffff) != uVar52);
      }
      psVar29->v[(long)iVar5 + -1] = (int)lVar8;
      extraout_RDX[(long)iVar5 + -1] = (int)lVar14;
      return (int)lVar8;
    }
  }
  psStack_3a0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psStack_3a0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psStack_3a0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_3a0->v + (long)psVar29->v[lVar8] * (long)iVar12);
    }
    a_02->v[lVar8] = (uint)psStack_3a0 & 0x3fffffff;
    psStack_3a0 = (secp256k1_modinv32_signed30 *)((long)psStack_3a0 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psStack_3a0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_3a0->v + (long)psVar29->v[8] * (long)iVar12);
  }
  iVar5 = (int)psStack_3a0;
  b = (secp256k1_modinv32_signed30 *)(long)iVar5;
  if (b == psStack_3a0) {
    a_02->v[8] = iVar5;
    return iVar5;
  }
  pcStack_3a8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar25 = *extraout_RDX_00;
  psVar48 = (secp256k1_modinv32_signed30 *)(long)(int)uVar25;
  uVar35 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar35;
  uVar37 = extraout_RDX_00[2];
  psVar20 = (secp256k1_modinv32_signed30 *)(long)(int)uVar37;
  lStack_3e0 = (long)(int)extraout_RDX_00[3];
  psVar30 = (secp256k1_fe *)0x9;
  pcStack_3f0 = (code *)0x155ac5;
  a_03 = a_02;
  piStack_3d0 = piVar19;
  psStack_3c8 = psVar42;
  uStack_3c0 = uVar47;
  uStack_3b0 = uVar52;
  pcStack_3a8 = (code *)puVar24;
  iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar5 < 1) {
    pcStack_3f0 = (code *)0x155d2d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00155d2d:
    pcStack_3f0 = (code *)0x155d32;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00155d32:
    pcStack_3f0 = (code *)0x155d37;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00155d37:
    pcStack_3f0 = (code *)0x155d3c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_00155d3c:
    pcStack_3f0 = (code *)0x155d41;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00155d41:
    pcStack_3f0 = (code *)0x155d46;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00155d46:
    pcStack_3f0 = (code *)0x155d4b;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_00155d4b:
    pcStack_3f0 = (code *)0x155d50;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar43 = b;
LAB_00155d50:
    pcStack_3f0 = (code *)0x155d55;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_00155d55:
    pcStack_3f0 = (code *)0x155d5a;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_00155d5a:
    pcStack_3f0 = (code *)0x155d5f;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155ae2;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar5) goto LAB_00155d2d;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155aff;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,-2);
    if (iVar5 < 1) goto LAB_00155d32;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155b1c;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,1);
    if (-1 < iVar5) goto LAB_00155d37;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar48;
    if (0 < (long)psVar48) {
      psVar43 = psVar48;
    }
    lVar14 = -lVar8;
    if (lVar8 < 1) {
      lVar14 = lVar8;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_00155d3c;
    psVar43 = (secp256k1_modinv32_signed30 *)-(long)psVar20;
    if (0 < (long)psVar20) {
      psVar43 = psVar20;
    }
    lVar14 = -lStack_3e0;
    if (lStack_3e0 < 1) {
      lVar14 = lStack_3e0;
    }
    if (lVar14 + 0x40000000 < (long)psVar43) goto LAB_00155d41;
    uVar17 = a_02->v[8] >> 0x1f;
    uVar4 = psVar29->v[8] >> 0x1f;
    psVar30 = (secp256k1_fe *)(ulong)uVar4;
    iVar5 = (uVar4 & uVar35) + (uVar17 & uVar25);
    a_03 = (secp256k1_modinv32_signed30 *)(psVar29->v[0] * lVar8 + (long)a_02->v[0] * (long)psVar48)
    ;
    lVar14 = (long)(int)(iVar5 - ((int)a_03 * b[1].v[0] + iVar5 & 0x3fffffffU));
    piVar16 = (int32_t *)((long)a_03->v + lVar14 * b->v[0]);
    if (((ulong)piVar16 & 0x3fffffff) != 0) goto LAB_00155d46;
    lStack_3d8 = lVar14;
    iVar5 = (uVar4 & (uint)lStack_3e0) + (uVar17 & uVar37);
    lVar15 = psVar29->v[0] * lStack_3e0 + (long)a_02->v[0] * (long)psVar20;
    a_03 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar25 = iVar5 - (b[1].v[0] * (int)lVar15 + iVar5 & 0x3fffffffU);
    psVar30 = (secp256k1_fe *)(ulong)uVar25;
    uVar52 = (long)b->v[0] * (long)(int)uVar25 + lVar15;
    if ((uVar52 & 0x3fffffff) != 0) goto LAB_00155d4b;
    lVar15 = (long)uVar52 >> 0x1e;
    lVar28 = (long)piVar16 >> 0x1e;
    lVar33 = 1;
    do {
      lVar28 = b->v[lVar33] * lVar14 + psVar29->v[lVar33] * lVar8 +
               (long)a_02->v[lVar33] * (long)psVar48 + lVar28;
      psVar43 = (secp256k1_modinv32_signed30 *)(psVar29->v[lVar33] * lStack_3e0);
      lVar15 = (long)psVar43->v +
               (long)a_02->v[lVar33] * (long)psVar20 + lVar15 +
               (long)b->v[lVar33] * (long)(int)uVar25;
      a_02->v[lVar33 + -1] = (uint)lVar28 & 0x3fffffff;
      psVar29->v[lVar33 + -1] = (uint)lVar15 & 0x3fffffff;
      lVar33 = lVar33 + 1;
      lVar15 = lVar15 >> 0x1e;
      lVar28 = lVar28 >> 0x1e;
    } while (lVar33 != 9);
    a_02->v[8] = (int32_t)lVar28;
    psVar29->v[8] = (int32_t)lVar15;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155cc6;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
    psVar20 = psVar29;
    psVar48 = b;
    if (iVar5 < 1) goto LAB_00155d50;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155ce3;
    a_03 = a_02;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar5) goto LAB_00155d55;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155cfc;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,-2);
    if (iVar5 < 1) goto LAB_00155d5a;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_3f0 = (code *)0x155d15;
    a_03 = psVar29;
    iVar5 = secp256k1_modinv32_mul_cmp_30(psVar29,9,b,1);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  pcStack_3f0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_3f0 = (code *)lVar8;
  psStack_3f8 = a_02;
  psStack_400 = psVar29;
  psStack_408 = psVar48;
  psStack_410 = psVar43;
  psStack_418 = psVar20;
  uVar25 = a_03->v[0];
  uVar34 = (ulong)uVar25;
  uVar35 = a_03->v[3];
  uVar7 = (ulong)uVar35;
  uVar37 = a_03->v[4];
  uVar13 = (ulong)uVar37;
  uVar4 = a_03->v[5];
  uVar47 = (ulong)uVar4;
  psVar29 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_03->v[6];
  uVar17 = a_03->v[7];
  uVar52 = (ulong)uVar17;
  iStack_41c = a_03->v[8];
  lVar8 = 0;
  do {
    if (a_03->v[lVar8] < -0x3fffffff) {
      pcStack_458 = (code *)0x1560ad;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_001560ad:
      pcStack_458 = (code *)0x1560b2;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_001560b2;
    }
    if (0x3fffffff < a_03->v[lVar8]) goto LAB_001560ad;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_43c = (uint)psVar30;
  psVar30 = (secp256k1_fe *)0x9;
  pcStack_458 = (code *)0x155dea;
  psVar29 = a_03;
  uStack_448 = a_03->v[1];
  uStack_444 = a_03->v[2];
  uStack_440 = a_03->v[6];
  psStack_438 = b_00;
  iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,b_00,-2);
  if (iVar5 < 1) {
LAB_001560b2:
    pcStack_458 = (code *)0x1560b7;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_001560b7:
    pcStack_458 = (code *)0x1560bc;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_001560bc:
    pcStack_458 = (code *)0x1560c1;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_001560c1:
    pcStack_458 = (code *)0x1560c6;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x155e09;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,1);
    if (-1 < iVar5) goto LAB_001560b7;
    uVar26 = iStack_41c >> 0x1f;
    uStack_420 = psStack_438->v[1];
    uVar10 = (uVar26 & uStack_420) + uStack_448;
    uStack_448 = psStack_438->v[2];
    uVar39 = (uVar26 & uStack_448) + uStack_444;
    uStack_444 = psStack_438->v[3];
    uStack_424 = psStack_438->v[4];
    uStack_428 = psStack_438->v[5];
    uStack_42c = psStack_438->v[6];
    uVar45 = (uVar26 & uStack_42c) + uStack_440;
    uStack_440 = psStack_438->v[7];
    uStack_44c = (int)uStack_43c >> 0x1f;
    uStack_43c = psStack_438->v[8];
    uVar41 = ((uVar26 & psStack_438->v[0]) + uVar25 ^ uStack_44c) - uStack_44c;
    uVar22 = ((int)uVar41 >> 0x1e) + ((uVar10 ^ uStack_44c) - uStack_44c);
    uVar10 = ((int)uVar22 >> 0x1e) + ((uVar39 ^ uStack_44c) - uStack_44c);
    uVar49 = ((int)uVar10 >> 0x1e) + (((uVar26 & uStack_444) + uVar35 ^ uStack_44c) - uStack_44c);
    uVar35 = ((int)uVar49 >> 0x1e) + (((uVar26 & uStack_424) + uVar37 ^ uStack_44c) - uStack_44c);
    uVar25 = ((int)uVar35 >> 0x1e) + (((uVar26 & uStack_428) + uVar4 ^ uStack_44c) - uStack_44c);
    uVar37 = ((int)uVar25 >> 0x1e) + ((uVar45 ^ uStack_44c) - uStack_44c);
    uVar4 = ((int)uVar37 >> 0x1e) + (((uVar26 & uStack_440) + uVar17 ^ uStack_44c) - uStack_44c);
    uVar23 = ((int)uVar4 >> 0x1e) + (((uVar26 & uStack_43c) + iStack_41c ^ uStack_44c) - uStack_44c)
    ;
    uVar47 = (ulong)uVar23;
    uStack_450 = (int)uVar23 >> 0x1f;
    uVar45 = (psStack_438->v[0] & uStack_450) + (uVar41 & 0x3fffffff);
    uVar39 = (uStack_428 & uStack_450) + (uVar25 & 0x3fffffff);
    uVar34 = (ulong)uVar39;
    uVar41 = (uStack_42c & uStack_450) + (uVar37 & 0x3fffffff);
    uVar7 = (ulong)uVar41;
    uVar25 = ((int)uVar45 >> 0x1e) + (uStack_420 & uStack_450) + (uVar22 & 0x3fffffff);
    uVar37 = ((int)uVar25 >> 0x1e) + (uStack_448 & uStack_450) + (uVar10 & 0x3fffffff);
    uVar17 = ((int)uVar37 >> 0x1e) + (uStack_444 & uStack_450) + (uVar49 & 0x3fffffff);
    uVar26 = ((int)uVar17 >> 0x1e) + (uStack_424 & uStack_450) + (uVar35 & 0x3fffffff);
    uVar39 = ((int)uVar26 >> 0x1e) + uVar39;
    uVar41 = ((int)uVar39 >> 0x1e) + uVar41;
    uVar35 = ((int)uVar41 >> 0x1e) + (uStack_440 & uStack_450) + (uVar4 & 0x3fffffff);
    uVar4 = ((int)uVar35 >> 0x1e) + (uStack_43c & uStack_450) + uVar23;
    uVar13 = (ulong)uVar4;
    uVar17 = uVar17 & 0x3fffffff;
    psVar30 = (secp256k1_fe *)(ulong)uVar17;
    uVar26 = uVar26 & 0x3fffffff;
    psVar29 = (secp256k1_modinv32_signed30 *)(ulong)uVar26;
    uVar35 = uVar35 & 0x3fffffff;
    uVar52 = (ulong)uVar35;
    a_03->v[0] = uVar45 & 0x3fffffff;
    a_03->v[1] = uVar25 & 0x3fffffff;
    a_03->v[2] = uVar37 & 0x3fffffff;
    a_03->v[3] = uVar17;
    a_03->v[4] = uVar26;
    a_03->v[5] = uVar39 & 0x3fffffff;
    a_03->v[6] = uVar41 & 0x3fffffff;
    a_03->v[7] = uVar35;
    a_03->v[8] = uVar4;
    if (0x3fffffff < uVar4) goto LAB_001560bc;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x15607a;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,0);
    if (iVar5 < 0) goto LAB_001560c1;
    psVar30 = (secp256k1_fe *)0x9;
    pcStack_458 = (code *)0x156095;
    psVar29 = a_03;
    iVar5 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_438,1);
    if (iVar5 < 0) {
      return iVar5;
    }
  }
  pcStack_458 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_518;
  psVar21 = &sStack_518;
  pcVar44 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar44 = secp256k1_fe_inv;
  }
  pcStack_520 = (code *)0x1560fc;
  uStack_480 = uVar52;
  uStack_478 = uVar47;
  uStack_470 = uVar7;
  psStack_468 = a_03;
  uStack_460 = uVar34;
  pcStack_458 = (code *)uVar13;
  (*pcVar44)(&sStack_518);
  if (psVar29 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar29->v + 8) = sStack_518.n[4];
    *(ulong *)(psVar29[1].v + 1) = CONCAT44(sStack_518.normalized,sStack_518.magnitude);
    *(uint64_t *)(psVar29->v + 4) = sStack_518.n[2];
    *(uint64_t *)(psVar29->v + 6) = sStack_518.n[3];
    *(uint64_t *)psVar29->v = sStack_518.n[0];
    *(uint64_t *)(psVar29->v + 2) = sStack_518.n[1];
  }
  uVar13 = 0xffffffffffff;
  sStack_4b8.n[0] = psVar30->n[0];
  sStack_4b8.n[1] = psVar30->n[1];
  sStack_4b8.n[2] = psVar30->n[2];
  sStack_4b8.n[3] = psVar30->n[3];
  sStack_4b8.n[4] = psVar30->n[4];
  sStack_4b8.magnitude = psVar30->magnitude;
  sStack_4b8.normalized = psVar30->normalized;
  psVar31 = &sStack_4b8;
  pcStack_520 = (code *)0x156165;
  secp256k1_fe_verify(psVar31);
  uVar52 = (sStack_4b8.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.n[0];
  if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
    uVar47 = (uVar52 >> 0x34) + sStack_4b8.n[1];
    uVar7 = (uVar47 >> 0x34) + sStack_4b8.n[2];
    uVar34 = (uVar7 >> 0x34) + sStack_4b8.n[3];
    uVar36 = (uVar34 >> 0x34) + (sStack_4b8.n[4] & 0xffffffffffff);
    if ((((uVar47 | uVar52 | uVar7 | uVar34) & 0xfffffffffffff) != 0 || uVar36 != 0) &&
       (((uVar52 | 0x1000003d0) & uVar47 & uVar7 & uVar34 & (uVar36 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015620c;
LAB_001565d6:
    pcStack_520 = (code *)0x1565e1;
    secp256k1_fe_verify(&sStack_518);
    uVar13 = sStack_518.n[4] & 0xffffffffffff;
    uVar52 = (sStack_518.n[4] >> 0x30) * 0x1000003d1 + sStack_518.n[0];
    uVar47 = (uVar52 >> 0x34) + sStack_518.n[1];
    uVar7 = (uVar47 >> 0x34) + sStack_518.n[2];
    r = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_518.n[3]);
    uVar34 = ((ulong)r >> 0x34) + uVar13;
    if (((uVar47 | uVar52 | uVar7 | (ulong)r) & 0xfffffffffffff) == 0 && uVar34 == 0) {
LAB_0015665d:
      return (int)uVar52;
    }
    r_00 = (secp256k1_fe *)(uVar34 ^ 0xf000000000000);
    uVar52 = (uVar52 ^ 0x1000003d0) & uVar47 & uVar7 & (ulong)r & (ulong)r_00;
    psVar21 = &sStack_518;
    if (uVar52 == 0xfffffffffffff) goto LAB_0015665d;
  }
  else {
LAB_0015620c:
    pcStack_520 = (code *)0x15621f;
    psVar31 = psVar30;
    secp256k1_fe_mul(&sStack_4b8,psVar30,&sStack_518);
    pcStack_520 = (code *)0x156227;
    secp256k1_fe_verify(&sStack_4b8);
    r_00 = &fe_minus_one;
    pcStack_520 = (code *)0x156233;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_4b8.magnitude < 0x20) {
      sStack_4b8.n[0] = sStack_4b8.n[0] + 0xffffefffffc2e;
      sStack_4b8.n[1] = sStack_4b8.n[1] + 0xfffffffffffff;
      sStack_4b8.n[2] = sStack_4b8.n[2] + 0xfffffffffffff;
      sStack_4b8.n[3] = sStack_4b8.n[3] + 0xfffffffffffff;
      sStack_4b8.n[4] = sStack_4b8.n[4] + 0xffffffffffff;
      sStack_4b8.normalized = 0;
      sStack_4b8.magnitude = sStack_4b8.magnitude + 1;
      pcStack_520 = (code *)0x156285;
      secp256k1_fe_verify(&sStack_4b8);
      pcStack_520 = (code *)0x15628d;
      secp256k1_fe_verify(&sStack_4b8);
      uVar52 = (sStack_4b8.n[4] >> 0x30) * 0x1000003d1 + sStack_4b8.n[0];
      uVar47 = (uVar52 >> 0x34) + sStack_4b8.n[1];
      uVar7 = (uVar47 >> 0x34) + sStack_4b8.n[2];
      psVar31 = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_4b8.n[3]);
      uVar34 = ((ulong)psVar31 >> 0x34) + (sStack_4b8.n[4] & 0xffffffffffff);
      if ((((uVar47 | uVar52 | uVar7 | (ulong)psVar31) & 0xfffffffffffff) != 0 || uVar34 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar34 ^ 0xf000000000000),
         ((uVar52 ^ 0x1000003d0) & uVar47 & uVar7 & (ulong)psVar31 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_00156674;
      sStack_4e8.n[0] = psVar30->n[0];
      sStack_4e8.n[1] = psVar30->n[1];
      sStack_4e8.n[2] = psVar30->n[2];
      sStack_4e8.n[3] = psVar30->n[3];
      sStack_4e8.n[4] = psVar30->n[4];
      sStack_4e8.magnitude = psVar30->magnitude;
      sStack_4e8.normalized = psVar30->normalized;
      psVar30 = &sStack_4e8;
      pcStack_520 = (code *)0x156333;
      secp256k1_fe_verify(psVar30);
      r_00 = &fe_minus_one;
      pcStack_520 = (code *)0x15633f;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4e8.magnitude) goto LAB_00156679;
      sStack_4e8.n[0] = sStack_4e8.n[0] + 0xffffefffffc2e;
      sStack_4e8.n[1] = sStack_4e8.n[1] + 0xfffffffffffff;
      sStack_4e8.n[2] = sStack_4e8.n[2] + 0xfffffffffffff;
      sStack_4e8.n[3] = sStack_4e8.n[3] + 0xfffffffffffff;
      sStack_4e8.n[4] = sStack_4e8.n[4] + 0xffffffffffff;
      sStack_4e8.normalized = 0;
      sStack_4e8.magnitude = sStack_4e8.magnitude + 1;
      pcStack_520 = (code *)0x15638a;
      secp256k1_fe_verify(&sStack_4e8);
      pcStack_520 = (code *)0x156392;
      secp256k1_fe_verify(&sStack_4e8);
      uVar52 = (sStack_4e8.n[4] >> 0x30) * 0x1000003d1 + sStack_4e8.n[0];
      if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
        uVar47 = (uVar52 >> 0x34) + sStack_4e8.n[1];
        uVar7 = (uVar47 >> 0x34) + sStack_4e8.n[2];
        uVar34 = (uVar7 >> 0x34) + sStack_4e8.n[3];
        uVar36 = (uVar34 >> 0x34) + (sStack_4e8.n[4] & 0xffffffffffff);
        if ((((uVar47 | uVar52 | uVar7 | uVar34) & 0xfffffffffffff) == 0 && uVar36 == 0) ||
           (uVar52 = (uVar52 | 0x1000003d0) & uVar47 & uVar7 & uVar34 & (uVar36 ^ 0xf000000000000),
           uVar52 == 0xfffffffffffff)) goto LAB_0015665d;
      }
      psVar31 = &sStack_4e8;
      pcStack_520 = (code *)0x156441;
      (*pcVar44)();
      pcStack_520 = (code *)0x15644c;
      secp256k1_fe_verify(&sStack_518);
      r_00 = &fe_minus_one;
      pcStack_520 = (code *)0x156458;
      secp256k1_fe_verify(&fe_minus_one);
      psVar30 = &sStack_518;
      if (0x1f < sStack_518.magnitude) goto LAB_0015667e;
      sStack_518.n[0] = sStack_518.n[0] + 0xffffefffffc2e;
      sStack_518.n[1] = sStack_518.n[1] + 0xfffffffffffff;
      sStack_518.n[2] = sStack_518.n[2] + 0xfffffffffffff;
      sStack_518.n[3] = sStack_518.n[3] + 0xfffffffffffff;
      sStack_518.n[4] = sStack_518.n[4] + 0xffffffffffff;
      sStack_518.magnitude = sStack_518.magnitude + 1;
      sStack_518.normalized = 0;
      pcStack_520 = (code *)0x1564a1;
      secp256k1_fe_verify(&sStack_518);
      pcStack_520 = (code *)0x1564aa;
      (*pcVar44)(&sStack_518);
      pcStack_520 = (code *)0x1564b2;
      secp256k1_fe_verify(&sStack_518);
      sStack_518.n[0] = sStack_518.n[0] + 1;
      sStack_518.magnitude = sStack_518.magnitude + 1;
      sStack_518.normalized = 0;
      pcStack_520 = (code *)0x1564c4;
      secp256k1_fe_verify(&sStack_518);
      pcStack_520 = (code *)0x1564cc;
      secp256k1_fe_verify(&sStack_518);
      psVar31 = &sStack_4e8;
      pcStack_520 = (code *)0x1564d9;
      r_00 = psVar31;
      secp256k1_fe_verify(psVar31);
      if (sStack_4e8.magnitude + sStack_518.magnitude < 0x21) {
        sStack_518.n[0] = sStack_518.n[0] + sStack_4e8.n[0];
        sStack_518.n[1] = sStack_518.n[1] + sStack_4e8.n[1];
        sStack_518.n[2] = sStack_518.n[2] + sStack_4e8.n[2];
        sStack_518.n[3] = sStack_518.n[3] + sStack_4e8.n[3];
        sStack_518.n[4] = sStack_518.n[4] + sStack_4e8.n[4];
        sStack_518.normalized = 0;
        pcStack_520 = (code *)0x156525;
        sStack_518.magnitude = sStack_4e8.magnitude + sStack_518.magnitude;
        secp256k1_fe_verify(&sStack_518);
        pcStack_520 = (code *)0x15652d;
        secp256k1_fe_verify(&sStack_518);
        uVar52 = (sStack_518.n[4] >> 0x30) * 0x1000003d1 + sStack_518.n[0];
        if (((uVar52 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar52 & 0xfffffffffffff) == 0)) {
          uVar13 = (uVar52 >> 0x34) + sStack_518.n[1];
          uVar47 = (uVar13 >> 0x34) + sStack_518.n[2];
          uVar7 = (uVar47 >> 0x34) + sStack_518.n[3];
          uVar34 = (uVar7 >> 0x34) + (sStack_518.n[4] & 0xffffffffffff);
          if ((((uVar13 | uVar52 | uVar47 | uVar7) & 0xfffffffffffff) == 0 && uVar34 == 0) ||
             (uVar52 = (uVar52 | 0x1000003d0) & uVar13 & uVar47 & uVar7 & (uVar34 ^ 0xf000000000000)
             , uVar52 == 0xfffffffffffff)) goto LAB_0015665d;
        }
        pcStack_520 = (code *)0x1565d6;
        test_inverse_field_cold_2();
        goto LAB_001565d6;
      }
    }
    else {
      pcStack_520 = (code *)0x156674;
      test_inverse_field_cold_7();
LAB_00156674:
      pcStack_520 = (code *)0x156679;
      test_inverse_field_cold_6();
LAB_00156679:
      pcStack_520 = (code *)0x15667e;
      test_inverse_field_cold_5();
LAB_0015667e:
      r = psVar31;
      psVar21 = psVar30;
      psVar31 = &sStack_4b8;
      pcStack_520 = (code *)0x156683;
      test_inverse_field_cold_4();
    }
    pcStack_520 = (code *)0x156688;
    test_inverse_field_cold_3();
  }
  pcStack_520 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_520 = (code *)0xfffffffffffff;
  psVar30 = (secp256k1_fe *)auStack_590;
  pcVar53 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar53 = secp256k1_scalar_inverse;
  }
  pcStack_598 = (code *)0x1566b6;
  auStack_550._32_8_ = psVar21;
  auStack_550._40_8_ = psVar31;
  (*pcVar53)(auStack_590);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_590._20_4_,auStack_590._16_4_);
    r_00->n[3] = CONCAT44(auStack_590._28_4_,auStack_590._24_4_);
    r_00->n[0] = CONCAT44(auStack_590._4_4_,auStack_590._0_4_);
    r_00->n[1] = CONCAT44(auStack_590._12_4_,auStack_590._8_4_);
  }
  pcStack_598 = (code *)0x1566d5;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar58._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar58._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar58._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar58._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar58);
  if (iVar5 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_550;
    pcStack_598 = (code *)0x156709;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x156711;
    psVar21 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_550._0_8_ != 1 || auStack_550._8_8_ != 0) || auStack_550._16_8_ != 0) ||
        auStack_550._24_8_ != 0) {
      pcStack_598 = (code *)0x15681b;
      test_inverse_scalar_cold_1();
      goto LAB_0015681b;
    }
    pcStack_598 = (code *)0x156741;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_590 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_598 = (code *)0x156749;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_590 + 0x20));
    auVar55._0_4_ = -(uint)(iStack_560 == 0 && auStack_590._32_4_ == 0);
    auVar55._4_4_ = -(uint)(iStack_55c == 0 && iStack_56c == 0);
    auVar55._8_4_ = -(uint)(iStack_558 == 0 && iStack_568 == 0);
    auVar55._12_4_ = -(uint)(iStack_554 == 0 && iStack_564 == 0);
    uVar25 = movmskps(extraout_EAX_00,auVar55);
    if (uVar25 == 0xf) {
      return 0;
    }
    a = (secp256k1_scalar *)(auStack_590 + 0x20);
    pcStack_598 = (code *)0x15677a;
    (*pcVar53)(a,a);
    pcStack_598 = (code *)0x15678f;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_590,&scalar_minus_one,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x156798;
    (*pcVar53)(auStack_590,auStack_590);
    pcStack_598 = (code *)0x1567aa;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_590,(secp256k1_scalar *)auStack_590,&secp256k1_scalar_one
              );
    pcStack_598 = (code *)0x1567b8;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_590,a,(secp256k1_scalar *)auStack_590);
    pcStack_598 = (code *)0x1567c0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_590);
    auVar56._0_4_ = -(uint)(auStack_590._16_4_ == 0 && auStack_590._0_4_ == 0);
    auVar56._4_4_ = -(uint)(auStack_590._20_4_ == 0 && auStack_590._4_4_ == 0);
    auVar56._8_4_ = -(uint)(auStack_590._24_4_ == 0 && auStack_590._8_4_ == 0);
    auVar56._12_4_ = -(uint)(auStack_590._28_4_ == 0 && auStack_590._12_4_ == 0);
    uVar25 = movmskps(extraout_EAX_01,auVar56);
    if (uVar25 == 0xf) {
      return 0;
    }
    pcStack_598 = (code *)0x1567e4;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_590;
  }
  pcStack_598 = (code *)0x1567ef;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_590);
  auVar57._0_4_ = -(uint)(auStack_590._16_4_ == 0 && auStack_590._0_4_ == 0);
  auVar57._4_4_ = -(uint)(auStack_590._20_4_ == 0 && auStack_590._4_4_ == 0);
  auVar57._8_4_ = -(uint)(auStack_590._24_4_ == 0 && auStack_590._8_4_ == 0);
  auVar57._12_4_ = -(uint)(auStack_590._28_4_ == 0 && auStack_590._12_4_ == 0);
  uVar25 = movmskps(extraout_EAX_02,auVar57);
  r = (secp256k1_fe *)auStack_590;
  psVar21 = psVar30;
  if (uVar25 == 0xf) {
    return 0;
  }
LAB_0015681b:
  pcStack_598 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_5b0 = 0x1000003d1;
  __s = auStack_1648;
  psStack_5c0 = r;
  pcStack_5b8 = pcVar44;
  psStack_5a8 = r_00;
  pcStack_5a0 = pcVar53;
  pcStack_598 = (code *)uVar13;
  memset(__s,0,0x1081);
  uStack_1658 = 0;
  lVar8 = 0x41;
  psStack_1650 = psVar21;
  secp256k1_hsort(__s,0x41,(size_t)psVar21,test_hsort_cmp,&uStack_1658);
  if (0x3f < uStack_1658) {
    test_hsort_is_sorted(auStack_1648,0x41,(size_t)psVar21);
    iVar5 = extraout_EAX_03;
    if (0 < COUNT) {
      iVar11 = 0;
      do {
        uVar6 = testrand_int(0x41);
        count = (size_t)(int)uVar6;
        testrand_bytes_test(auStack_1648,count * (long)psVar21);
        secp256k1_hsort(auStack_1648,count,(size_t)psVar21,test_hsort_cmp,&uStack_1658);
        test_hsort_is_sorted(auStack_1648,count,(size_t)psVar21);
        iVar11 = iVar11 + 1;
        iVar5 = extraout_EAX_04;
      } while (iVar11 < COUNT);
    }
    return iVar5;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar14 = 0;
    uVar52 = extraout_RAX;
    do {
      uVar13 = uVar52 & 0xffffffff;
      bVar9 = __s[lVar14];
      bVar1 = *(byte *)(lVar8 + lVar14);
      uVar52 = (ulong)((uint)bVar9 - (uint)bVar1);
      if (bVar9 == bVar1) {
        uVar52 = uVar13;
      }
      if (bVar9 != bVar1) {
        return (int)uVar52;
      }
      lVar14 = lVar14 + 1;
    } while (extraout_RDX_01[1] != lVar14);
  }
  return 0;
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}